

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmTargetTraceDependencies::CheckCustomCommand(cmTargetTraceDependencies *this,cmCustomCommand *cc)

{
  pointer pcVar1;
  string *name;
  cmLocalGenerator *lg;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  this_00;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  cmCustomCommandLines *pcVar3;
  cmGeneratorTarget *pcVar4;
  _Base_ptr p_Var5;
  string *conf;
  pointer pbVar6;
  pointer pbVar7;
  pointer pcVar8;
  allocator<char> local_119;
  cmTargetTraceDependencies *local_118;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  cmGeneratorExpression ge;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_90;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  targets;
  string local_50;
  
  local_118 = this;
  p_Var2 = (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
           cmCustomCommand::GetBacktrace(cc);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,p_Var2);
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &targets._M_t._M_impl.super__Rb_tree_header._M_header;
  targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar3 = cmCustomCommand::GetCommandLines(cc);
  pcVar1 = (pcVar3->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar8 = (pcVar3->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar1; pcVar8 = pcVar8 + 1) {
    name = (pcVar8->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = cmLocalGenerator::FindGeneratorTargetToUse(local_118->LocalGenerator,name);
    if ((pcVar4 != (cmGeneratorTarget *)0x0) && (pcVar4->Target->TargetTypeValue == EXECUTABLE)) {
      cmTarget::AddUtility(local_118->GeneratorTarget->Target,name,(cmMakefile *)0x0);
    }
    pbVar6 = (pcVar8->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = (pcVar8->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar6; pbVar7 = pbVar7 + 1)
    {
      cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
      this_00 = cge;
      lg = local_118->GeneratorTarget->LocalGenerator;
      std::__cxx11::string::string<std::allocator<char>>((string *)&emitted,"",&local_119);
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&configs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)configs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      cmCompiledGeneratorExpression::Evaluate
                ((cmCompiledGeneratorExpression *)
                 this_00._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,lg,
                 (string *)&emitted,true,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0,(string *)&configs);
      std::__cxx11::string::~string((string *)&configs);
      std::__cxx11::string::~string((string *)&emitted);
      std::
      _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
      ::_Rb_tree((_Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                  *)&emitted,
                 (_Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                  *)((long)cge._M_t.
                           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                           _M_head_impl + 0x50));
      std::
      _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<cmGeneratorTarget*>>
                ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                  *)&targets,
                 (_Rb_tree_const_iterator<cmGeneratorTarget_*>)
                 emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<cmGeneratorTarget_*>)
                 &emitted._M_t._M_impl.super__Rb_tree_header);
      std::
      _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
      ::~_Rb_tree((_Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                   *)&emitted);
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr(&cge);
    }
  }
  for (p_Var5 = targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &targets._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    cmTarget::AddUtility
              (local_118->GeneratorTarget->Target,(string *)(**(long **)(p_Var5 + 1) + 0xc0),
               (cmMakefile *)0x0);
  }
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cmMakefile::GetConfigurations(&local_50,local_118->Makefile,&configs,true);
  std::__cxx11::string::~string((string *)&local_50);
  if (configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&configs);
  }
  pbVar7 = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar7; pbVar6 = pbVar6 + 1) {
    FollowCommandDepends(local_118,cc,pbVar6,&emitted);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emitted._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  std::
  _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  ::~_Rb_tree(&targets._M_t);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTargetTraceDependencies::CheckCustomCommand(cmCustomCommand const& cc)
{
  // Transform command names that reference targets built in this
  // project to corresponding target-level dependencies.
  cmGeneratorExpression ge(cc.GetBacktrace());

  // Add target-level dependencies referenced by generator expressions.
  std::set<cmGeneratorTarget*> targets;

  for (cmCustomCommandLine const& cCmdLine : cc.GetCommandLines()) {
    std::string const& command = cCmdLine.front();
    // Check for a target with this name.
    if (cmGeneratorTarget* t =
          this->LocalGenerator->FindGeneratorTargetToUse(command)) {
      if (t->GetType() == cmStateEnums::EXECUTABLE) {
        // The command refers to an executable target built in
        // this project.  Add the target-level dependency to make
        // sure the executable is up to date before this custom
        // command possibly runs.
        this->GeneratorTarget->Target->AddUtility(command);
      }
    }

    // Check for target references in generator expressions.
    for (std::string const& cl : cCmdLine) {
      const std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(cl);
      cge->Evaluate(this->GeneratorTarget->GetLocalGenerator(), "", true);
      std::set<cmGeneratorTarget*> geTargets = cge->GetTargets();
      targets.insert(geTargets.begin(), geTargets.end());
    }
  }

  for (cmGeneratorTarget* target : targets) {
    this->GeneratorTarget->Target->AddUtility(target->GetName());
  }

  // Queue the custom command dependencies.
  std::vector<std::string> configs;
  std::set<std::string> emitted;
  this->Makefile->GetConfigurations(configs);
  if (configs.empty()) {
    configs.emplace_back();
  }
  for (std::string const& conf : configs) {
    this->FollowCommandDepends(cc, conf, emitted);
  }
}